

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O0

void __thiscall MeCab::ContextID::addBOS(ContextID *this,char *l,char *r)

{
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  
  std::__cxx11::string::operator=((string *)(in_RDI + 0x60),in_RSI);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x80),in_RDX);
  return;
}

Assistant:

void ContextID::addBOS(const char *l, const char *r) {
  left_bos_ = l;
  right_bos_ = r;
}